

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teaminfo.cpp
# Opt level: O3

void Cmd_teamlist(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined4 in_register_00000014;
  ulong uVar1;
  long lVar2;
  
  Printf("Defined teams are as follows:\n",who,CONCAT44(in_register_00000014,key));
  if (Teams.Count != 0) {
    lVar2 = 0x10;
    uVar1 = 0;
    do {
      Printf("%d : %s\n",uVar1 & 0xffffffff,
             *(undefined8 *)((long)&(Teams.Array)->m_iPlayerCount + lVar2));
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x38;
    } while (uVar1 < Teams.Count);
  }
  Printf("End of team list.\n");
  return;
}

Assistant:

CCMD (teamlist)
{
	Printf ("Defined teams are as follows:\n");

	for (unsigned int uiTeam = 0; uiTeam < Teams.Size (); uiTeam++)
		Printf ("%d : %s\n", uiTeam, Teams[uiTeam].GetName ());

	Printf ("End of team list.\n");
}